

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::Interpreter
          (Interpreter *this,Allocator *alloc,ExtMap *ext_vars,uint max_stack,double gc_min_objects,
          double gc_growth_trigger,VmNativeCallbackMap *native_callbacks,
          JsonnetImportCallback *import_callback,void *import_callback_context)

{
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *this_00;
  BuiltinMap *this_01;
  _Rb_tree_header *p_Var1;
  HeapEntity *pHVar2;
  pointer pFVar3;
  bool bVar4;
  Identifier *pIVar5;
  Var *pVVar6;
  mapped_type *pmVar7;
  DesugaredObject *ast;
  HeapThunk *pHVar8;
  _Base_ptr p_Var9;
  HeapObject *pHVar10;
  long lVar11;
  u32string *this_02;
  _Rb_tree_node_base *p_Var12;
  mapped_type *ppHVar13;
  Value v;
  Value v_00;
  UString name;
  string local_b8;
  Stack *local_98;
  Allocator *local_90;
  _Rb_tree_node_base *local_88;
  SourceFuncMap *local_80;
  vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
  *local_78;
  _Rb_tree_node_base *local_70;
  VmNativeCallbackMap *local_68;
  ExtMap *local_60;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *local_58;
  string local_50;
  
  (this->heap).gcTuneMinObjects = (uint)(long)gc_min_objects;
  (this->heap).gcTuneGrowthTrigger = gc_growth_trigger;
  (this->heap).lastMark = '\0';
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap).lastNumEntities = 0;
  (this->heap).numEntities = 0;
  (this->stack)._vptr_Stack = (_func_int **)&PTR_dump_0022f660;
  (this->stack).calls = 0;
  local_98 = &this->stack;
  (this->stack).limit = max_stack;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->alloc = alloc;
  local_88 = (_Rb_tree_node_base *)native_callbacks;
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&name,L"import",(allocator<char32_t> *)&local_b8);
  pIVar5 = Allocator::makeIdentifier(alloc,&name);
  std::__cxx11::u32string::~u32string((u32string *)&name);
  this->idImport = pIVar5;
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&name,L"array_element",(allocator<char32_t> *)&local_b8);
  pIVar5 = Allocator::makeIdentifier(alloc,&name);
  std::__cxx11::u32string::~u32string((u32string *)&name);
  this->idArrayElement = pIVar5;
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&name,L"object_assert",(allocator<char32_t> *)&local_b8);
  pIVar5 = Allocator::makeIdentifier(alloc,&name);
  std::__cxx11::u32string::~u32string((u32string *)&name);
  this->idInvariant = pIVar5;
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&name,L"__internal__",(allocator<char32_t> *)&local_b8);
  pIVar5 = Allocator::makeIdentifier(alloc,&name);
  std::__cxx11::u32string::~u32string((u32string *)&name);
  this->idInternal = pIVar5;
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&name,L"_",(allocator<char32_t> *)&local_b8);
  pIVar5 = Allocator::makeIdentifier(alloc,&name);
  std::__cxx11::u32string::~u32string((u32string *)&name);
  this->idJsonObjVar = pIVar5;
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&name,L"",(allocator<char32_t> *)&local_b8);
  pIVar5 = Allocator::makeIdentifier(alloc,&name);
  std::__cxx11::u32string::~u32string((u32string *)&name);
  this->idEmpty = pIVar5;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0]._0_1_ = 0;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_90 = alloc;
  pVVar6 = Allocator::
           make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::Identifier_const*&>
                     (alloc,(LocationRange *)&name,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)&local_b8,&this->idJsonObjVar);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)&local_b8);
  std::__cxx11::string::~string((string *)&name);
  this->jsonObjVar = &pVVar6->super_AST;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_70;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_70;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = &this->externalVars;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  ::_Rb_tree(&local_60->_M_t,&ext_vars->_M_t);
  local_68 = &this->nativeCallbacks;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
  ::_Rb_tree(&local_68->_M_t,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
              *)local_88);
  this->importCallback = import_callback;
  this->importCallbackContext = import_callback_context;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_01 = &this->builtins;
  p_Var1 = &(this->builtins)._M_t._M_impl.super__Rb_tree_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = &this->sourceVals;
  local_88 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_88;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_88;
  (this->scratch).t = NULL_TYPE;
  local_78 = (vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
              *)&this->sourceFuncIds;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"makeArray",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinMakeArray;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"pow",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinPow;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"floor",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinFloor;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"ceil",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinCeil;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"sqrt",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinSqrt;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"sin",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinSin;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"cos",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinCos;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"tan",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinTan;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"asin",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinAsin;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"acos",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinAcos;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"atan",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinAtan;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"type",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinType;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"filter",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinFilter;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"objectHasEx",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinObjectHasEx;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"length",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinLength;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"objectFieldsEx",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinObjectFieldsEx;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"codepoint",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinCodepoint;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"char",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinChar;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"log",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinLog;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"exp",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinExp;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"mantissa",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinMantissa;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"exponent",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinExponent;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"modulo",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinModulo;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"extVar",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinExtVar;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"primitiveEquals",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinPrimitiveEquals;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"native",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinNative;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"md5",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinMd5;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"trace",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinTrace;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"splitLimit",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinSplitLimit;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"substr",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinSubstr;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"range",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinRange;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"strReplace",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinStrReplace;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"asciiLower",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinAsciiLower;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"asciiUpper",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinAsciiUpper;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"join",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinJoin;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"parseJson",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinParseJson;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"parseYaml",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinParseYaml;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"encodeUTF8",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinEncodeUTF8;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"decodeUTF8",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinDecodeUTF8;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"atan2",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinAtan2;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"hypot",(allocator<char> *)&local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,(key_type *)&name);
  *pmVar7 = (mapped_type)builtinHypot;
  pmVar7[1] = 0;
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"__internal__",(allocator<char> *)&name);
  ast = makeStdlibAST(local_90,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  jsonnet_static_analysis(&ast->super_AST);
  this->stdlibAST = ast;
  pHVar8 = (HeapThunk *)operator_new(0x70);
  this_00 = &(this->heap).entities;
  HeapThunk::HeapThunk(pHVar8,(Identifier *)0x0,(HeapObject *)0x0,0,&ast->super_AST);
  name._M_dataplus._M_p = (pointer)pHVar8;
  local_58 = this_00;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(this_00,(value_type *)&name);
  (pHVar8->super_HeapEntity).mark = (this->heap).lastMark;
  (this->heap).numEntities =
       (long)(this->heap).entities.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->heap).entities.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  bVar4 = Heap::checkHeap(&this->heap);
  if (bVar4) {
    Heap::markFrom(&this->heap,(HeapEntity *)pHVar8);
    Stack::mark(local_98,&this->heap);
    v._4_4_ = 0;
    v.t = (this->scratch).t;
    v.v.h = (this->scratch).v.h;
    Heap::markFrom(&this->heap,v);
    for (p_Var9 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var9 != local_70; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      if (*(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40) != (HeapEntity *)0x0) {
        Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40));
      }
    }
    for (p_Var9 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var9 != local_88; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var9 + 2));
    }
    Heap::sweep(&this->heap);
  }
  Stack::newCall(local_98,&pHVar8->body->location,(HeapEntity *)pHVar8,pHVar8->self,pHVar8->offset,
                 &pHVar8->upValues);
  evaluate(this,pHVar8->body,0);
  pHVar2 = (this->scratch).v.h;
  if (pHVar2 == (HeapEntity *)0x0) {
    pHVar10 = (HeapObject *)0x0;
  }
  else {
    pHVar10 = (HeapObject *)
              __dynamic_cast(pHVar2,&(anonymous_namespace)::HeapEntity::typeinfo,
                             &(anonymous_namespace)::HeapObject::typeinfo,0);
  }
  this->stdObject = pHVar10;
  pFVar3 = (this->stdlibAST->fields).
           super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (local_90 = (Allocator *)
                  (this->stdlibAST->fields).
                  super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_90 != (Allocator *)pFVar3;
      local_90 = (Allocator *)((long)local_90 + 0x18)) {
    if (((pointer)local_90)->name->type == AST_LITERAL_STRING) {
      lVar11 = __dynamic_cast(((pointer)local_90)->name,&AST::typeinfo,&LiteralString::typeinfo);
      std::__cxx11::u32string::u32string
                ((u32string *)&name,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 (lVar11 + 0x80));
      this_02 = (u32string *)operator_new(0x20);
      std::__cxx11::u32string::u32string(this_02,&name);
      local_b8._M_dataplus._M_p = (pointer)this_02;
      std::
      vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
      ::emplace_back<jsonnet::internal::Identifier*>(local_78,(Identifier **)&local_b8);
      pIVar5 = (this->sourceFuncIds).
               super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>
               ._M_t.
               super__Tuple_impl<0UL,_jsonnet::internal::Identifier_*,_std::default_delete<jsonnet::internal::Identifier>_>
               .super__Head_base<0UL,_jsonnet::internal::Identifier_*,_false>._M_head_impl;
      pHVar8 = (HeapThunk *)operator_new(0x70);
      HeapThunk::HeapThunk(pHVar8,pIVar5,this->stdObject,0,*(AST **)((long)local_90 + 0x10));
      local_b8._M_dataplus._M_p = (pointer)pHVar8;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
      ::push_back(local_58,(value_type *)&local_b8);
      (pHVar8->super_HeapEntity).mark = (this->heap).lastMark;
      (this->heap).numEntities =
           (long)(this->heap).entities.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->heap).entities.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      bVar4 = Heap::checkHeap(&this->heap);
      if (bVar4) {
        Heap::markFrom(&this->heap,(HeapEntity *)pHVar8);
        Stack::mark(local_98,&this->heap);
        v_00._4_4_ = 0;
        v_00.t = (this->scratch).t;
        v_00.v.h = (this->scratch).v.h;
        Heap::markFrom(&this->heap,v_00);
        for (p_Var12 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var12 != local_70; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          if (*(HeapEntity **)(*(long *)(p_Var12 + 3) + 0x40) != (HeapEntity *)0x0) {
            Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var12 + 3) + 0x40));
          }
        }
        for (p_Var12 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var12 != local_88; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var12 + 2));
        }
        Heap::sweep(&this->heap);
      }
      encode_utf8(&local_b8,&name);
      ppHVar13 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 ::operator[](local_80,&local_b8);
      *ppHVar13 = pHVar8;
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::u32string::~u32string((u32string *)&name);
    }
  }
  return;
}

Assistant:

Interpreter(Allocator *alloc, const ExtMap &ext_vars, unsigned max_stack, double gc_min_objects,
                double gc_growth_trigger, const VmNativeCallbackMap &native_callbacks,
                JsonnetImportCallback *import_callback, void *import_callback_context)

        : heap(gc_min_objects, gc_growth_trigger),
          stack(max_stack),
          alloc(alloc),
          idImport(alloc->makeIdentifier(U"import")),
          idArrayElement(alloc->makeIdentifier(U"array_element")),
          idInvariant(alloc->makeIdentifier(U"object_assert")),
          idInternal(alloc->makeIdentifier(U"__internal__")),
          idJsonObjVar(alloc->makeIdentifier(U"_")),
          idEmpty(alloc->makeIdentifier(U"")),
          jsonObjVar(alloc->make<Var>(LocationRange(), Fodder{}, idJsonObjVar)),
          externalVars(ext_vars),
          nativeCallbacks(native_callbacks),
          importCallback(import_callback),
          importCallbackContext(import_callback_context)
    {
        scratch = makeNull();
        builtins["makeArray"] = &Interpreter::builtinMakeArray;
        builtins["pow"] = &Interpreter::builtinPow;
        builtins["floor"] = &Interpreter::builtinFloor;
        builtins["ceil"] = &Interpreter::builtinCeil;
        builtins["sqrt"] = &Interpreter::builtinSqrt;
        builtins["sin"] = &Interpreter::builtinSin;
        builtins["cos"] = &Interpreter::builtinCos;
        builtins["tan"] = &Interpreter::builtinTan;
        builtins["asin"] = &Interpreter::builtinAsin;
        builtins["acos"] = &Interpreter::builtinAcos;
        builtins["atan"] = &Interpreter::builtinAtan;
        builtins["type"] = &Interpreter::builtinType;
        builtins["filter"] = &Interpreter::builtinFilter;
        builtins["objectHasEx"] = &Interpreter::builtinObjectHasEx;
        builtins["length"] = &Interpreter::builtinLength;
        builtins["objectFieldsEx"] = &Interpreter::builtinObjectFieldsEx;
        builtins["codepoint"] = &Interpreter::builtinCodepoint;
        builtins["char"] = &Interpreter::builtinChar;
        builtins["log"] = &Interpreter::builtinLog;
        builtins["exp"] = &Interpreter::builtinExp;
        builtins["mantissa"] = &Interpreter::builtinMantissa;
        builtins["exponent"] = &Interpreter::builtinExponent;
        builtins["modulo"] = &Interpreter::builtinModulo;
        builtins["extVar"] = &Interpreter::builtinExtVar;
        builtins["primitiveEquals"] = &Interpreter::builtinPrimitiveEquals;
        builtins["native"] = &Interpreter::builtinNative;
        builtins["md5"] = &Interpreter::builtinMd5;
        builtins["trace"] = &Interpreter::builtinTrace;
        builtins["splitLimit"] = &Interpreter::builtinSplitLimit;
        builtins["substr"] = &Interpreter::builtinSubstr;
        builtins["range"] = &Interpreter::builtinRange;
        builtins["strReplace"] = &Interpreter::builtinStrReplace;
        builtins["asciiLower"] = &Interpreter::builtinAsciiLower;
        builtins["asciiUpper"] = &Interpreter::builtinAsciiUpper;
        builtins["join"] = &Interpreter::builtinJoin;
        builtins["parseJson"] = &Interpreter::builtinParseJson;
        builtins["parseYaml"] = &Interpreter::builtinParseYaml;
        builtins["encodeUTF8"] = &Interpreter::builtinEncodeUTF8;
        builtins["decodeUTF8"] = &Interpreter::builtinDecodeUTF8;
        builtins["atan2"] = &Interpreter::builtinAtan2;
        builtins["hypot"] = &Interpreter::builtinHypot;

        DesugaredObject *stdlib = makeStdlibAST(alloc, "__internal__");
        jsonnet_static_analysis(stdlib);
        stdlibAST = stdlib; // stdlibAST is const, so we need to do analysis before this assignment
        auto stdThunk = makeHeap<HeapThunk>(nullptr, nullptr, 0, static_cast<const AST*>(stdlibAST));
        stack.newCall(stdThunk->body->location, stdThunk, stdThunk->self, stdThunk->offset, stdThunk->upValues);
        evaluate(stdThunk->body, 0);
        stdObject = dynamic_cast<HeapObject*>(scratch.v.h);
        prepareSourceValThunks();
    }